

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::bind<tcu::Matrix<float,3,2>>
          (Environment *this,Variable<tcu::Matrix<float,_3,_2>_> *variable,IVal *value)

{
  deInt32 *pdVar1;
  pointer pcVar2;
  _func_int **__dest;
  mapped_type local_50;
  key_type local_40;
  
  __dest = (_func_int **)operator_new__(0x90);
  memcpy(__dest,value,0x90);
  pcVar2 = (variable->m_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (variable->m_name)._M_string_length);
  local_50.m_state = (SharedPtrStateBase *)0x0;
  local_50.m_ptr = (uchar *)__dest;
  local_50.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_50.m_state)->strongRefCount = 0;
  (local_50.m_state)->weakRefCount = 0;
  (local_50.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b3ca08;
  local_50.m_state[1]._vptr_SharedPtrStateBase = __dest;
  (local_50.m_state)->strongRefCount = 1;
  (local_50.m_state)->weakRefCount = 1;
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_40,&local_50);
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_50.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_50.m_ptr = (uchar *)0x0;
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_50.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}